

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcalc.c
# Opt level: O2

void FT_Matrix_Multiply(FT_Matrix *a,FT_Matrix *b)

{
  FT_Long FVar1;
  FT_Long b_;
  FT_Long FVar2;
  FT_Long FVar3;
  FT_Long FVar4;
  FT_Long FVar5;
  FT_Long FVar6;
  FT_Long FVar7;
  FT_Long FVar8;
  FT_Long FVar9;
  
  if (b != (FT_Matrix *)0x0 && a != (FT_Matrix *)0x0) {
    FVar9 = a->xx;
    FVar1 = b->xx;
    FVar2 = FT_MulFix(FVar9,FVar1);
    FVar8 = a->xy;
    FVar7 = b->yx;
    FVar3 = FT_MulFix(FVar8,FVar7);
    b_ = b->xy;
    FVar4 = FT_MulFix(FVar9,b_);
    FVar9 = b->yy;
    FVar5 = FT_MulFix(FVar8,FVar9);
    FVar8 = a->yx;
    FVar6 = FT_MulFix(FVar8,FVar1);
    FVar1 = a->yy;
    FVar7 = FT_MulFix(FVar1,FVar7);
    FVar8 = FT_MulFix(FVar8,b_);
    FVar9 = FT_MulFix(FVar1,FVar9);
    b->xx = FVar3 + FVar2;
    b->xy = FVar5 + FVar4;
    b->yx = FVar7 + FVar6;
    b->yy = FVar9 + FVar8;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Matrix_Multiply( const FT_Matrix*  a,
                      FT_Matrix        *b )
  {
    FT_Fixed  xx, xy, yx, yy;


    if ( !a || !b )
      return;

    xx = ADD_LONG( FT_MulFix( a->xx, b->xx ),
                   FT_MulFix( a->xy, b->yx ) );
    xy = ADD_LONG( FT_MulFix( a->xx, b->xy ),
                   FT_MulFix( a->xy, b->yy ) );
    yx = ADD_LONG( FT_MulFix( a->yx, b->xx ),
                   FT_MulFix( a->yy, b->yx ) );
    yy = ADD_LONG( FT_MulFix( a->yx, b->xy ),
                   FT_MulFix( a->yy, b->yy ) );

    b->xx = xx;
    b->xy = xy;
    b->yx = yx;
    b->yy = yy;
  }